

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_add_mem(void *vx,void *vy,int bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint in_EDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int offset;
  uint32_t *y4;
  uint32_t *x4;
  int four;
  uint64_t *y8;
  uint64_t *x8;
  int eight;
  uint8_t *y1;
  uint8_t *x1;
  __m128i y3_1;
  __m128i x3_1;
  __m128i y2_1;
  __m128i x2_1;
  __m128i y1_2;
  __m128i x1_2;
  __m128i y0_1;
  __m128i x0_1;
  __m256i y3;
  __m256i x3;
  __m256i y2;
  __m256i x2;
  __m256i y1_1;
  __m256i x1_1;
  __m256i y0;
  __m256i x0;
  __m256i *y32;
  __m256i *x32;
  __m128i *y16;
  __m128i *x16;
  ulong *local_4c8;
  ulong *local_4c0;
  ulong *local_4b8;
  ulong *local_4b0;
  uint local_4a4;
  
  local_4c8 = in_RSI;
  local_4c0 = in_RDI;
  local_4b8 = in_RSI;
  local_4b0 = in_RDI;
  local_4a4 = in_EDX;
  if (CpuHasAVX2) {
    for (; 0x7f < (int)local_4a4; local_4a4 = local_4a4 - 0x80) {
      uVar1 = local_4c8[1];
      uVar2 = local_4c8[2];
      uVar3 = local_4c8[3];
      uVar4 = local_4c8[4];
      uVar5 = local_4c8[5];
      uVar6 = local_4c8[6];
      uVar7 = local_4c8[7];
      uVar8 = local_4c8[8];
      uVar9 = local_4c8[9];
      uVar10 = local_4c8[10];
      uVar11 = local_4c8[0xb];
      uVar12 = local_4c8[0xc];
      uVar13 = local_4c8[0xd];
      uVar14 = local_4c8[0xe];
      uVar15 = local_4c8[0xf];
      *local_4c0 = *local_4c0 ^ *local_4c8;
      local_4c0[1] = local_4c0[1] ^ uVar1;
      local_4c0[2] = local_4c0[2] ^ uVar2;
      local_4c0[3] = local_4c0[3] ^ uVar3;
      local_4c0[4] = local_4c0[4] ^ uVar4;
      local_4c0[5] = local_4c0[5] ^ uVar5;
      local_4c0[6] = local_4c0[6] ^ uVar6;
      local_4c0[7] = local_4c0[7] ^ uVar7;
      local_4c0[8] = local_4c0[8] ^ uVar8;
      local_4c0[9] = local_4c0[9] ^ uVar9;
      local_4c0[10] = local_4c0[10] ^ uVar10;
      local_4c0[0xb] = local_4c0[0xb] ^ uVar11;
      local_4c0[0xc] = local_4c0[0xc] ^ uVar12;
      local_4c0[0xd] = local_4c0[0xd] ^ uVar13;
      local_4c0[0xe] = local_4c0[0xe] ^ uVar14;
      local_4c0[0xf] = local_4c0[0xf] ^ uVar15;
      local_4c0 = local_4c0 + 0x10;
      local_4c8 = local_4c8 + 0x10;
    }
    for (; 0x1f < (int)local_4a4; local_4a4 = local_4a4 - 0x20) {
      uVar1 = local_4c8[1];
      uVar2 = local_4c8[2];
      uVar3 = local_4c8[3];
      *local_4c0 = *local_4c0 ^ *local_4c8;
      local_4c0[1] = local_4c0[1] ^ uVar1;
      local_4c0[2] = local_4c0[2] ^ uVar2;
      local_4c0[3] = local_4c0[3] ^ uVar3;
      local_4c0 = local_4c0 + 4;
      local_4c8 = local_4c8 + 4;
    }
    local_4b0 = local_4c0;
    local_4b8 = local_4c8;
  }
  else {
    for (; 0x3f < (int)local_4a4; local_4a4 = local_4a4 - 0x40) {
      uVar1 = local_4b8[1];
      uVar2 = local_4b8[2];
      uVar3 = local_4b8[3];
      uVar4 = local_4b8[4];
      uVar5 = local_4b8[5];
      uVar6 = local_4b8[6];
      uVar7 = local_4b8[7];
      *local_4b0 = *local_4b0 ^ *local_4b8;
      local_4b0[1] = local_4b0[1] ^ uVar1;
      local_4b0[2] = local_4b0[2] ^ uVar2;
      local_4b0[3] = local_4b0[3] ^ uVar3;
      local_4b0[4] = local_4b0[4] ^ uVar4;
      local_4b0[5] = local_4b0[5] ^ uVar5;
      local_4b0[6] = local_4b0[6] ^ uVar6;
      local_4b0[7] = local_4b0[7] ^ uVar7;
      local_4b0 = local_4b0 + 8;
      local_4b8 = local_4b8 + 8;
    }
  }
  for (; 0xf < (int)local_4a4; local_4a4 = local_4a4 - 0x10) {
    uVar1 = local_4b8[1];
    *local_4b0 = *local_4b0 ^ *local_4b8;
    local_4b0[1] = local_4b0[1] ^ uVar1;
    local_4b0 = local_4b0 + 2;
    local_4b8 = local_4b8 + 2;
  }
  uVar16 = local_4a4 & 8;
  if (uVar16 != 0) {
    *local_4b0 = *local_4b8 ^ *local_4b0;
  }
  if ((local_4a4 & 4) != 0) {
    *(uint *)((long)local_4b0 + (long)(int)uVar16) =
         *(uint *)((long)local_4b8 + (long)(int)uVar16) ^
         *(uint *)((long)local_4b0 + (long)(int)uVar16);
  }
  iVar17 = uVar16 + (local_4a4 & 4);
  local_4a4 = local_4a4 & 3;
  if (local_4a4 != 1) {
    if (local_4a4 != 2) {
      if (local_4a4 != 3) {
        return;
      }
      *(byte *)((long)local_4b0 + (long)(iVar17 + 2)) =
           *(byte *)((long)local_4b0 + (long)(iVar17 + 2)) ^
           *(byte *)((long)local_4b8 + (long)(iVar17 + 2));
    }
    *(byte *)((long)local_4b0 + (long)(iVar17 + 1)) =
         *(byte *)((long)local_4b0 + (long)(iVar17 + 1)) ^
         *(byte *)((long)local_4b8 + (long)(iVar17 + 1));
  }
  *(byte *)((long)local_4b0 + (long)iVar17) =
       *(byte *)((long)local_4b0 + (long)iVar17) ^ *(byte *)((long)local_4b8 + (long)iVar17);
  return;
}

Assistant:

void gf256_add_mem(void * GF256_RESTRICT vx,
                              const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<GF256_M128 *>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128 *>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*) x16);
            GF256_M128 x1 = vld1q_u8((uint8_t*)(x16 + 1) );
            GF256_M128 x2 = vld1q_u8((uint8_t*)(x16 + 2) );
            GF256_M128 x3 = vld1q_u8((uint8_t*)(x16 + 3) );
            GF256_M128 y0 = vld1q_u8((uint8_t*)y16);
            GF256_M128 y1 = vld1q_u8((uint8_t*)(y16 + 1));
            GF256_M128 y2 = vld1q_u8((uint8_t*)(y16 + 2));
            GF256_M128 y3 = vld1q_u8((uint8_t*)(y16 + 3));

            vst1q_u8((uint8_t*)x16,     veorq_u8(x0, y0));
            vst1q_u8((uint8_t*)(x16 + 1), veorq_u8(x1, y1));
            vst1q_u8((uint8_t*)(x16 + 2), veorq_u8(x2, y2));
            vst1q_u8((uint8_t*)(x16 + 3), veorq_u8(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 y0 = vld1q_u8((uint8_t*)y16);

            vst1q_u8((uint8_t*)x16, veorq_u8(x0, y0));

            bytes -= 16, ++x16, ++y16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT x8 = reinterpret_cast<uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            x8[ii] ^= y8[ii];

        x16 = reinterpret_cast<GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        while (bytes >= 128)
        {
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 y0 = _mm256_loadu_si256(y32);
            x0 = _mm256_xor_si256(x0, y0);
            GF256_M256 x1 = _mm256_loadu_si256(x32 + 1);
            GF256_M256 y1 = _mm256_loadu_si256(y32 + 1);
            x1 = _mm256_xor_si256(x1, y1);
            GF256_M256 x2 = _mm256_loadu_si256(x32 + 2);
            GF256_M256 y2 = _mm256_loadu_si256(y32 + 2);
            x2 = _mm256_xor_si256(x2, y2);
            GF256_M256 x3 = _mm256_loadu_si256(x32 + 3);
            GF256_M256 y3 = _mm256_loadu_si256(y32 + 3);
            x3 = _mm256_xor_si256(x3, y3);

            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
            _mm256_storeu_si256(x32 + 2, x2);
            _mm256_storeu_si256(x32 + 3, x3);

            bytes -= 128, x32 += 4, y32 += 4;
        }

        // Handle multiples of 32 bytes
        while (bytes >= 32)
        {
            // x[i] = x[i] xor y[i]
            _mm256_storeu_si256(x32,
                _mm256_xor_si256(
                    _mm256_loadu_si256(x32),
                    _mm256_loadu_si256(y32)));

            bytes -= 32, ++x32, ++y32;
        }

        x16 = reinterpret_cast<GF256_M128 *>(x32);
        y16 = reinterpret_cast<const GF256_M128 *>(y32);
    }
    else
# endif // GF256_TRY_AVX2
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 y0 = _mm_loadu_si128(y16);
            x0 = _mm_xor_si128(x0, y0);
            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 y1 = _mm_loadu_si128(y16 + 1);
            x1 = _mm_xor_si128(x1, y1);
            GF256_M128 x2 = _mm_loadu_si128(x16 + 2);
            GF256_M128 y2 = _mm_loadu_si128(y16 + 2);
            x2 = _mm_xor_si128(x2, y2);
            GF256_M128 x3 = _mm_loadu_si128(x16 + 3);
            GF256_M128 y3 = _mm_loadu_si128(y16 + 3);
            x3 = _mm_xor_si128(x3, y3);

            _mm_storeu_si128(x16, x0);
            _mm_storeu_si128(x16 + 1, x1);
            _mm_storeu_si128(x16 + 2, x2);
            _mm_storeu_si128(x16 + 3, x3);

            bytes -= 64, x16 += 4, y16 += 4;
        }
    }
#endif // GF256_TARGET_MOBILE

#if !defined(GF256_TARGET_MOBILE)
    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // x[i] = x[i] xor y[i]
        _mm_storeu_si128(x16,
            _mm_xor_si128(
                _mm_loadu_si128(x16),
                _mm_loadu_si128(y16)));

        bytes -= 16, ++x16, ++y16;
    }
#endif

    uint8_t * GF256_RESTRICT x1 = reinterpret_cast<uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT x8 = reinterpret_cast<uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *x8 ^= *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT x4 = reinterpret_cast<uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *x4 ^= *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: x1[offset + 2] ^= y1[offset + 2];
    case 2: x1[offset + 1] ^= y1[offset + 1];
    case 1: x1[offset] ^= y1[offset];
    default:
        break;
    }
}